

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DeviceContextBase
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          DeviceImplType *pRenderDevice,DeviceContextDesc *Desc)

{
  DEVICE_FEATURE_STATE DVar1;
  Char *pCVar2;
  RenderDeviceInfo *pRVar3;
  RenderDeviceVkImpl *pRVar4;
  char (*Args_1) [21];
  char *pcVar5;
  COMMAND_QUEUE_TYPE local_1b1;
  RefCntAutoPtr<Diligent::TextureViewVkImpl> *local_140;
  Rect *local_128;
  Viewport *local_100;
  VertexStreamInfo<Diligent::BufferVkImpl> *local_d0;
  undefined1 local_c8 [8];
  string msg;
  string local_a0;
  byte local_7b;
  byte local_7a;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  byte local_36;
  allocator local_35 [13];
  DeviceContextDesc *local_28;
  DeviceContextDesc *Desc_local;
  DeviceImplType *pRenderDevice_local;
  IReferenceCounters *pRefCounters_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  local_28 = Desc;
  Desc_local = (DeviceContextDesc *)pRenderDevice;
  pRenderDevice_local = (DeviceImplType *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  ObjectBase<Diligent::IDeviceContextVk>::ObjectBase
            (&this->super_ObjectBase<Diligent::IDeviceContextVk>,pRefCounters);
  (this->super_ObjectBase<Diligent::IDeviceContextVk>).
  super_RefCountedObject<Diligent::IDeviceContextVk>.super_IDeviceContextVk.super_IDeviceContext.
  super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_013a1528;
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::RefCntAutoPtr
            (&this->m_pDevice,(RenderDeviceVkImpl *)Desc_local);
  local_d0 = this->m_VertexStreams;
  do {
    VertexStreamInfo<Diligent::BufferVkImpl>::VertexStreamInfo(local_d0);
    local_d0 = local_d0 + 1;
  } while (local_d0 != (VertexStreamInfo<Diligent::BufferVkImpl> *)&this->m_NumVertexStreams);
  this->m_NumVertexStreams = 0;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::RefCntAutoPtr(&this->m_pPipelineState);
  RefCntAutoPtr<Diligent::BufferVkImpl>::RefCntAutoPtr(&this->m_pIndexBuffer);
  this->m_IndexDataStartOffset = 0;
  this->m_StencilRef = 0;
  this->m_BlendFactors[0] = -1.0;
  this->m_BlendFactors[1] = -1.0;
  this->m_BlendFactors[2] = -1.0;
  this->m_BlendFactors[3] = -1.0;
  local_100 = this->m_Viewports;
  do {
    Viewport::Viewport(local_100);
    local_100 = local_100 + 1;
  } while (local_100 != (Viewport *)&this->m_NumViewports);
  this->m_NumViewports = 0;
  local_128 = this->m_ScissorRects;
  do {
    Rect::Rect(local_128);
    local_128 = local_128 + 1;
  } while (local_128 != (Rect *)&this->m_NumScissorRects);
  this->m_NumScissorRects = 0;
  local_140 = this->m_pBoundRenderTargets;
  do {
    RefCntAutoPtr<Diligent::TextureViewVkImpl>::RefCntAutoPtr(local_140);
    local_140 = local_140 + 1;
  } while (local_140 != (RefCntAutoPtr<Diligent::TextureViewVkImpl> *)&this->m_NumBoundRenderTargets
          );
  this->m_NumBoundRenderTargets = 0;
  this->m_FramebufferWidth = 0;
  this->m_FramebufferHeight = 0;
  this->m_FramebufferSlices = 0;
  this->m_FramebufferSamples = 0;
  RefCntAutoPtr<Diligent::TextureViewVkImpl>::RefCntAutoPtr(&this->m_pBoundDepthStencil);
  RefCntAutoPtr<Diligent::FramebufferVkImpl>::RefCntAutoPtr(&this->m_pBoundFramebuffer);
  RefCntAutoPtr<Diligent::RenderPassVkImpl>::RefCntAutoPtr(&this->m_pActiveRenderPass);
  RefCntAutoPtr<Diligent::ITextureView>::RefCntAutoPtr(&this->m_pBoundShadingRateMap);
  this->m_SubpassIndex = 0;
  this->m_RenderPassAttachmentsTransitionMode = RESOURCE_STATE_TRANSITION_MODE_NONE;
  this->m_FrameNumber = 0;
  RefCntAutoPtr<Diligent::IObject>::RefCntAutoPtr(&this->m_pUserData);
  local_36 = 0;
  local_7a = 0;
  local_7b = 0;
  msg.field_2._M_local_buf[0xf] = '\0';
  msg.field_2._M_local_buf[0xe] = '\0';
  if ((local_28->Name == (Char *)0x0) || (*local_28->Name == '\0')) {
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string((string *)&local_78,"Context #",&local_79);
    local_7b = 1;
    std::__cxx11::to_string(&local_a0,(uint)local_28->ContextId);
    msg.field_2._M_local_buf[0xf] = '\x01';
    std::operator+(&local_58,&local_78,&local_a0);
    msg.field_2._M_local_buf[0xe] = '\x01';
    pcVar5 = " (immediate)";
    if ((local_28->IsDeferred & 1U) != 0) {
      pcVar5 = " (deferred)";
    }
    std::operator+(&this->m_Name,&local_58,pcVar5);
  }
  else {
    pcVar5 = local_28->Name;
    std::allocator<char>::allocator();
    local_36 = 1;
    std::__cxx11::string::string((string *)&this->m_Name,pcVar5,local_35);
  }
  if ((msg.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((msg.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  if ((local_36 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  pCVar2 = (Char *)std::__cxx11::string::c_str();
  if ((local_28->IsDeferred & 1U) == 0) {
    local_1b1 = local_28->QueueType;
  }
  else {
    local_1b1 = COMMAND_QUEUE_TYPE_UNKNOWN;
  }
  DeviceContextDesc::DeviceContextDesc
            (&this->m_Desc,pCVar2,local_1b1,(Bool)(local_28->IsDeferred & 1),
             (uint)local_28->ContextId,(uint)local_28->QueueId);
  pRVar3 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetDeviceInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)Desc_local);
  DVar1 = (pRVar3->Features).NativeMultiDraw;
  Args_1 = (char (*) [21])CONCAT71((int7)((ulong)pRVar3 >> 8),DVar1);
  this->m_NativeMultiDrawSupported = DVar1 != DEVICE_FEATURE_STATE_DISABLED;
  IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag>::IndexWrapper
            (&this->m_DstImmediateContextId,0xff);
  DeviceContextStats::DeviceContextStats(&this->m_Stats);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_ScratchSpace);
  std::
  unordered_map<Diligent::IBuffer_*,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo,_std::hash<Diligent::IBuffer_*>,_std::equal_to<Diligent::IBuffer_*>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>_>
  ::unordered_map(&this->m_DbgMappedBuffers);
  this->m_DvpDebugGroupCount = 0;
  this->m_DvpRenderTargetFormatsHash = 0;
  pRVar4 = Diligent::RefCntAutoPtr::operator_cast_to_RenderDeviceVkImpl_
                     ((RefCntAutoPtr *)&this->m_pDevice);
  if (pRVar4 == (RenderDeviceVkImpl *)0x0) {
    FormatString<char[26],char[21]>
              ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pDevice != nullptr",Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"DeviceContextBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa8);
    std::__cxx11::string::~string((string *)local_c8);
  }
  return;
}

Assistant:

DeviceContextBase(IReferenceCounters*      pRefCounters,
                      DeviceImplType*          pRenderDevice,
                      const DeviceContextDesc& Desc) :
        // clang-format off
        TObjectBase{pRefCounters },
        m_pDevice  {pRenderDevice},
        m_Name
        {
            Desc.Name != nullptr && *Desc.Name != '\0' ?
                String{Desc.Name} :
                String{"Context #"} + std::to_string(Uint32{Desc.ContextId}) + (Desc.IsDeferred ? " (deferred)" : " (immediate)")
        },
        m_Desc
        {
            m_Name.c_str(),
            Desc.IsDeferred ? COMMAND_QUEUE_TYPE_UNKNOWN : Desc.QueueType,
            Desc.IsDeferred,
            Desc.ContextId,
            Desc.QueueId
        },
        m_NativeMultiDrawSupported{pRenderDevice->GetDeviceInfo().Features.NativeMultiDraw != DEVICE_FEATURE_STATE_DISABLED}
    // clang-format on
    {
        VERIFY_EXPR(m_pDevice != nullptr);
    }